

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O2

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<unsigned_int,void>(ostream_base *this,uint v)

{
  ostream_base *poVar1;
  pair<const_char_*,_const_char_*> pVar2;
  span<const_char,__1L> s;
  base10storage<unsigned_int> str;
  not_null<std::array<char,_10UL>_*> local_30;
  array<char,_10UL> local_28;
  
  local_30.ptr_ = &local_28;
  local_28._M_elems[8] = '\0';
  local_28._M_elems[9] = '\0';
  local_28._M_elems[0] = '\0';
  local_28._M_elems[1] = '\0';
  local_28._M_elems[2] = '\0';
  local_28._M_elems[3] = '\0';
  local_28._M_elems[4] = '\0';
  local_28._M_elems[5] = '\0';
  local_28._M_elems[6] = '\0';
  local_28._M_elems[7] = '\0';
  gsl::not_null<std::array<char,_10UL>_*>::ensure_invariant(&local_30);
  pVar2 = details::to_characters<unsigned_int,_void>(v,local_30);
  s = gsl::make_span<char_const>(pVar2.first,pVar2.second);
  poVar1 = write<_1l>(this,s);
  return poVar1;
}

Assistant:

ostream_base & write (Unsigned const v) {
                    details::base10storage<Unsigned> str{{}};
                    auto res = details::to_characters (v, &str);
                    return this->write (gsl::make_span (res.first, res.second));
                }